

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  uint32_t __hostlong;
  uint32_t __hostlong_00;
  _ENetListNode *p_Var1;
  int iVar2;
  undefined1 local_70 [8];
  ENetProtocol command;
  ENetChannel *channel;
  ENetPeer *currentPeer;
  _ENetListNode *p_Stack_28;
  enet_uint32 data_local;
  size_t channelCount_local;
  ENetAddress *address_local;
  ENetHost *host_local;
  
  if (channelCount == 0) {
    p_Stack_28 = (_ENetListNode *)0x1;
  }
  else {
    p_Stack_28 = (_ENetListNode *)channelCount;
    if (0xff < channelCount) {
      p_Stack_28 = (_ENetListNode *)0xff;
    }
  }
  channel = (ENetChannel *)host->peers;
  while ((channel < host->peers + host->peerCount &&
         (*(int *)&(channel->incomingReliableCommands).sentinel.previous != 0))) {
    channel = (ENetChannel *)&channel[5].incomingReliableCommands.sentinel.previous;
  }
  if (channel < host->peers + host->peerCount) {
    currentPeer._4_4_ = data;
    channelCount_local = (size_t)address;
    address_local = (ENetAddress *)host;
    p_Var1 = (_ENetListNode *)enet_malloc((long)p_Stack_28 * 0x50);
    (channel->incomingUnreliableCommands).sentinel.next = p_Var1;
    if ((channel->incomingUnreliableCommands).sentinel.next == (_ENetListNode *)0x0) {
      host_local = (ENetHost *)0x0;
    }
    else {
      (channel->incomingUnreliableCommands).sentinel.previous = p_Stack_28;
      *(undefined4 *)&(channel->incomingReliableCommands).sentinel.previous = 1;
      *(undefined8 *)(channel->reliableWindows + 0xf) = *(undefined8 *)channelCount_local;
      iVar2 = *(int *)&address_local[3].port + 1;
      *(int *)&address_local[3].port = iVar2;
      *(int *)(channel->reliableWindows + 0xb) = iVar2;
      if (address_local[2].host == 0) {
        *(undefined4 *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4) = 0x10000;
      }
      else {
        *(enet_uint32 *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4) =
             (address_local[2].host >> 0x10) << 0xc;
      }
      if (*(uint *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4) < 0x1000) {
        *(undefined4 *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4) = 0x1000;
      }
      else if (0x10000 < *(uint *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4)) {
        *(undefined4 *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4) = 0x10000;
      }
      for (command._40_8_ = (channel->incomingUnreliableCommands).sentinel.next;
          (ulong)command._40_8_ <
          (channel->incomingUnreliableCommands).sentinel.next + (long)p_Stack_28 * 5;
          command._40_8_ = command._40_8_ + 0x50) {
        *(undefined2 *)command._40_8_ = 0;
        *(undefined2 *)(command._40_8_ + 2) = 0;
        *(undefined2 *)(command._40_8_ + 0x26) = 0;
        *(undefined2 *)(command._40_8_ + 0x28) = 0;
        enet_list_clear((ENetList *)(command._40_8_ + 0x30));
        enet_list_clear((ENetList *)(command._40_8_ + 0x40));
        *(undefined2 *)(command._40_8_ + 4) = 0;
        memset((void *)(command._40_8_ + 6),0,0x20);
      }
      local_70[0] = 0x82;
      local_70[1] = 0xff;
      local_70._4_2_ = htons(channel->reliableWindows[10]);
      local_70[6] = *(enet_uint8 *)((long)channel->reliableWindows + 0x1b);
      local_70[7] = (undefined1)channel->reliableWindows[0xd];
      command.header =
           (ENetProtocolCommandHeader)
           htonl(*(uint32_t *)&channel[2].incomingReliableCommands.sentinel.next);
      command.disconnect.data =
           htonl(*(uint32_t *)((long)&channel[2].incomingReliableCommands.sentinel.next + 4));
      command.connect.mtu = htonl((uint32_t)p_Stack_28);
      command.connect.windowSize = htonl(*(uint32_t *)&address_local[1].port);
      command.connect.channelCount = htonl(address_local[2].host);
      __hostlong._0_2_ = channel[2].usedReliableWindows;
      __hostlong._2_2_ = channel[2].reliableWindows[0];
      command.connect.incomingBandwidth = htonl(__hostlong);
      command.connect.outgoingBandwidth =
           htonl(*(uint32_t *)((long)&channel[1].incomingUnreliableCommands.sentinel.previous + 4));
      __hostlong_00._0_2_ = channel[2].outgoingReliableSequenceNumber;
      __hostlong_00._2_2_ = channel[2].outgoingUnreliableSequenceNumber;
      command.connect.packetThrottleInterval = htonl(__hostlong_00);
      command.connect.packetThrottleAcceleration = *(undefined4 *)(channel->reliableWindows + 0xb);
      command.connect.packetThrottleDeceleration = htonl(currentPeer._4_4_);
      enet_peer_queue_outgoing_command
                ((ENetPeer *)channel,(ENetProtocol *)local_70,(ENetPacket *)0x0,0,0);
      host_local = (ENetHost *)channel;
    }
  }
  else {
    host_local = (ENetHost *)0x0;
  }
  return (ENetPeer *)host_local;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (currentPeer >= & host -> peers [host -> peerCount])
      return NULL;

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_16 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}